

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

string * __thiscall
cmLocalGenerator::GetFrameworkFlags
          (string *__return_storage_ptr__,cmLocalGenerator *this,string *l,string *config,
          cmGeneratorTarget *target)

{
  cmMakefile *this_00;
  bool bVar1;
  cmLocalGenerator *this_01;
  char *pcVar2;
  cmComputeLinkInformation *this_02;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  pointer pbVar4;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  string frameworkDir;
  string fwSearchFlagVar;
  string local_50;
  
  this_01 = cmGeneratorTarget::GetLocalGenerator(target);
  this_00 = this_01->Makefile;
  std::__cxx11::string::string((string *)&emitted,"APPLE",(allocator *)&fwSearchFlagVar);
  bVar1 = cmMakefile::IsOn(this_00,(string *)&emitted);
  std::__cxx11::string::~string((string *)&emitted);
  if (bVar1) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&emitted,
                   "CMAKE_",l);
    std::operator+(&fwSearchFlagVar,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&emitted,
                   "_FRAMEWORK_SEARCH_FLAG");
    std::__cxx11::string::~string((string *)&emitted);
    pcVar2 = cmMakefile::GetDefinition(this_00,&fwSearchFlagVar);
    if ((pcVar2 == (char *)0x0) || (*pcVar2 == '\0')) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    }
    else {
      emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &emitted._M_t._M_impl.super__Rb_tree_header._M_header;
      emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      emitted._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      includes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      includes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      includes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      std::__cxx11::string::string((string *)&frameworkDir,"C",(allocator *)&local_50);
      GetIncludeDirectories(this_01,&includes,target,&frameworkDir,config,true);
      std::__cxx11::string::~string((string *)&frameworkDir);
      for (pbVar4 = includes.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar4 != includes.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar4 = pbVar4 + 1) {
        bVar1 = cmGlobalGenerator::NameResolvesToFramework(this_01->GlobalGenerator,pbVar4);
        if (bVar1) {
          std::__cxx11::string::string((string *)&frameworkDir,(string *)pbVar4);
          std::__cxx11::string::append((char *)&frameworkDir);
          cmsys::SystemTools::CollapseFullPath(&local_50,&frameworkDir);
          std::__cxx11::string::operator=((string *)&frameworkDir,(string *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&emitted,&frameworkDir);
          std::__cxx11::string::~string((string *)&frameworkDir);
        }
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      this_02 = cmGeneratorTarget::GetLinkInformation(target,config);
      if (this_02 != (cmComputeLinkInformation *)0x0) {
        pvVar3 = cmComputeLinkInformation::GetFrameworkPaths_abi_cxx11_(this_02);
        for (pbVar4 = (pvVar3->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            pbVar4 != (pvVar3->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish; pbVar4 = pbVar4 + 1) {
          pVar5 = std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)&emitted,pbVar4);
          if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            cmOutputConverter::ConvertToOutputFormat
                      (&frameworkDir,&this_01->super_cmOutputConverter,pbVar4,SHELL);
            std::__cxx11::string::append((string *)__return_storage_ptr__);
            std::__cxx11::string::~string((string *)&frameworkDir);
            std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&includes);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&emitted._M_t);
    }
    std::__cxx11::string::~string((string *)&fwSearchFlagVar);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalGenerator::GetFrameworkFlags(std::string const& l,
                                                std::string const& config,
                                                cmGeneratorTarget* target)
{
  return ::GetFrameworkFlags(l, config, target);
}